

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

Pubkey * __thiscall
cfd::core::SchnorrPubkey::CreatePubkey
          (Pubkey *__return_storage_ptr__,SchnorrPubkey *this,bool parity)

{
  Pubkey *this_00;
  ByteData local_78;
  ByteData local_50;
  undefined1 local_38 [8];
  ByteData data;
  uint8_t head;
  bool parity_local;
  SchnorrPubkey *this_local;
  
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = parity | 2;
  this_00 = __return_storage_ptr__;
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = parity;
  ByteData::ByteData(&local_50,
                     data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_);
  ByteData::Concat<cfd::core::ByteData256>((ByteData *)local_38,&local_50,&this->data_);
  ByteData::~ByteData((ByteData *)0x48e0da);
  ByteData::ByteData(&this_00->data_,&__return_storage_ptr__->data_);
  Pubkey::Pubkey(__return_storage_ptr__,&local_78);
  ByteData::~ByteData((ByteData *)0x48e104);
  ByteData::~ByteData((ByteData *)0x48e10d);
  return this_00;
}

Assistant:

Pubkey SchnorrPubkey::CreatePubkey(bool parity) const {
  uint8_t head = (parity) ? 3 : 2;
  ByteData data = ByteData(head).Concat(data_);
  return Pubkey(data);
}